

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict compound_stmt(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  pos_t p;
  int iVar2;
  node_t_conflict op2;
  node_t_conflict op1;
  char *expected_name;
  bool bVar3;
  undefined1 local_50 [8];
  pos_t pos;
  node_t_conflict r;
  node_t_conflict list;
  node_t_conflict n;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  iVar2 = match(c2m_ctx,0x7b,(pos_t *)local_50,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar2 == 0) {
    error_recovery(c2m_ctx,0,"{");
    c2m_ctx_local = (c2m_ctx_t)&err_struct;
  }
  else {
    op2 = new_node(c2m_ctx,N_LIST);
    op1 = new_node(c2m_ctx,N_LIST);
    p._8_8_ = pos.fname;
    p.fname = (char *)local_50;
    c2m_ctx_local = (c2m_ctx_t)new_pos_node2(c2m_ctx,N_BLOCK,p,op1,op2);
    c2m_ctx_local->options = (c2mir_options *)ppVar1->curr_scope;
    ppVar1->curr_scope = (node_t_conflict)c2m_ctx_local;
    while( true ) {
      bVar3 = false;
      if ((short)*(undefined4 *)ppVar1->curr_token != 0x7d) {
        bVar3 = (short)*(undefined4 *)ppVar1->curr_token != 0x13d;
      }
      if (!bVar3) break;
      pos._8_8_ = try_f(c2m_ctx,declaration);
      if (((node *)pos._8_8_ == &err_struct) &&
         (pos._8_8_ = stmt(c2m_ctx,no_err_p), (node *)pos._8_8_ == &err_struct)) {
        error_recovery(c2m_ctx,1,"<statement>");
      }
      else {
        op_flat_append(c2m_ctx,op2,(node_t_conflict)pos._8_8_);
      }
    }
    ppVar1->curr_scope = (node_t_conflict)c2m_ctx_local->options;
    if ((short)*(undefined4 *)ppVar1->curr_token == 0x13d) {
      error(c2m_ctx,0x1d8369,(char *)local_50,pos.fname);
      c2m_ctx_local = (c2m_ctx_t)&err_struct;
    }
    else {
      iVar2 = match(c2m_ctx,0x7d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 == 0) {
        if (ppVar1->record_level == 0) {
          expected_name = get_token_name(c2m_ctx,0x7d);
          syntax_error(c2m_ctx,expected_name);
        }
        c2m_ctx_local = (c2m_ctx_t)&err_struct;
      }
    }
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

D (compound_stmt) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t n, list, r;
  pos_t pos;

  PTE ('{', pos, err0);
  list = new_node (c2m_ctx, N_LIST);
  n = new_pos_node2 (c2m_ctx, N_BLOCK, pos, new_node (c2m_ctx, N_LIST), list);
  n->attr = curr_scope;
  curr_scope = n;
  while (!C ('}') && !C (T_EOFILE)) { /* block-item-list, block_item */
    if ((r = TRY (declaration)) != err_node) {
    } else {
      PE (stmt, err1);
    }
    op_flat_append (c2m_ctx, list, r);
    continue;
  err1:
    error_recovery (c2m_ctx, 1, "<statement>");
  }
  curr_scope = n->attr;
  if (C (T_EOFILE)) {
    error (c2m_ctx, pos, "unfinished compound statement");
    return err_node;
  }
  PT ('}');
  return n;
err0:
  error_recovery (c2m_ctx, 0, "{");
  return err_node;
}